

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall
draco::Mesh::ApplyPointIdDeduplication
          (Mesh *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
          *id_map,vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  *unique_point_ids)

{
  bool bVar1;
  const_reference i;
  reference this_00;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  *in_RSI;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_stack_00000010;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  *in_stack_00000018;
  PointCloud *in_stack_00000020;
  int32_t c;
  FaceIndex f;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *in_stack_ffffffffffffffb8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  *this_01;
  int local_24;
  ValueType local_20;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_1c [3];
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  *local_10;
  
  local_10 = in_RSI;
  PointCloud::ApplyPointIdDeduplication(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_1c,0);
  while( true ) {
    local_20 = num_faces((Mesh *)0x18e372);
    bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(local_1c,&local_20);
    if (!bVar1) break;
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      this_01 = local_10;
      IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
      ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
                    *)local_10,in_stack_ffffffffffffffb8);
      std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)this_01,
                 (size_type)in_stack_ffffffffffffffb8);
      i = IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
          ::operator[](this_01,(IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                               in_stack_ffffffffffffffb8);
      IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
      ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
                    *)this_01,in_stack_ffffffffffffffb8);
      this_00 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                            *)this_01,(size_type)in_stack_ffffffffffffffb8);
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(this_00,i);
    }
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(local_1c);
  }
  return;
}

Assistant:

void Mesh::ApplyPointIdDeduplication(
    const IndexTypeVector<PointIndex, PointIndex> &id_map,
    const std::vector<PointIndex> &unique_point_ids) {
  PointCloud::ApplyPointIdDeduplication(id_map, unique_point_ids);
  for (FaceIndex f(0); f < num_faces(); ++f) {
    for (int32_t c = 0; c < 3; ++c) {
      faces_[f][c] = id_map[faces_[f][c]];
    }
  }
}